

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

void lua_rawgeti(lua_State *L,int idx,int n)

{
  TValue *pTVar1;
  cTValue *pcVar2;
  cTValue cVar3;
  GCtab *t;
  
  pTVar1 = index2adr(L,idx);
  t = (GCtab *)(pTVar1->u64 & 0x7fffffffffff);
  if ((uint)n < t->asize) {
    pcVar2 = (cTValue *)((long)n * 8 + (t->array).ptr64);
  }
  else {
    pcVar2 = lj_tab_getinth(t,n);
  }
  if (pcVar2 == (cTValue *)0x0) {
    cVar3.u64 = 0xffffffffffffffff;
  }
  else {
    cVar3 = *pcVar2;
  }
  *L->top = cVar3;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if (pTVar1 + 1 < (TValue *)(L->maxstack).ptr64) {
    return;
  }
  lj_state_growstack1(L);
  return;
}

Assistant:

LUA_API void lua_rawgeti(lua_State *L, int idx, int n)
{
  cTValue *v, *t = index2adr(L, idx);
  lj_checkapi(tvistab(t), "stack slot %d is not a table", idx);
  v = lj_tab_getint(tabV(t), n);
  if (v) {
    copyTV(L, L->top, v);
  } else {
    setnilV(L->top);
  }
  incr_top(L);
}